

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O2

void init_ctrade_array(vector<Trade,_std::allocator<Trade>_> *c,
                      vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_> *trades)

{
  pointer pTVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  std::vector<Trade,_std::allocator<Trade>_>::resize
            (c,((long)(trades->
                      super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(trades->
                     super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0xe0);
  lVar3 = 0;
  lVar4 = 0;
  for (uVar2 = 0;
      pTVar1 = (trades->super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>)
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(trades->
                             super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0xe0);
      uVar2 = uVar2 + 1) {
    init_ctrade((Trade *)((long)&((c->super__Vector_base<Trade,_std::allocator<Trade>_>)._M_impl.
                                  super__Vector_impl_data._M_start)->account_id + lVar3),
                (Trade *)((long)&(pTVar1->account_id)._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + 0xe0;
    lVar3 = lVar3 + 0x4c;
  }
  return;
}

Assistant:

void init_ctrade_array(vector<Trade>* c, const vector<tquant::api::Trade>* trades)
{
    c->resize(trades->size());
    for (size_t i =0; i < trades->size(); i++) {
        auto p1 = &(*c)[i];
        auto p2 = &(*trades)[i];
        init_ctrade(p1, p2);
    }
}